

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O0

int run_test_has_ref(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_80 [8];
  uv_idle_t h;
  
  puVar2 = uv_default_loop();
  uv_idle_init(puVar2,(uv_idle_t *)local_80);
  uv_ref((uv_handle_t *)local_80);
  iVar1 = uv_has_ref((uv_handle_t *)local_80);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
            ,0x1b8,"uv_has_ref((uv_handle_t*)&h) == 1");
    abort();
  }
  uv_unref((uv_handle_t *)local_80);
  iVar1 = uv_has_ref((uv_handle_t *)local_80);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
            ,0x1ba,"uv_has_ref((uv_handle_t*)&h) == 0");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
            ,0x1bb,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(has_ref) {
  uv_idle_t h;
  uv_idle_init(uv_default_loop(), &h);
  uv_ref((uv_handle_t*)&h);
  ASSERT(uv_has_ref((uv_handle_t*)&h) == 1);
  uv_unref((uv_handle_t*)&h);
  ASSERT(uv_has_ref((uv_handle_t*)&h) == 0);
  MAKE_VALGRIND_HAPPY();
  return 0;
}